

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

void ctemplate::EmitModifiedString
               (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                *modifiers,char *in,size_t inlen,PerExpandData *data,ExpandEmitter *outbuf)

{
  char *pcVar1;
  TemplateModifier *pTVar2;
  pointer pMVar3;
  string output_of_this_modifier;
  string result;
  string value_string;
  StringEmitter scratchbuf2;
  StringEmitter scratchbuf;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [16];
  char *local_c0;
  size_t local_b8;
  char local_b0 [16];
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  ExpandEmitter *local_80;
  undefined **local_78;
  undefined **local_70;
  string *local_68;
  undefined **local_60;
  char **local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_c0 = local_b0;
  local_b8 = 0;
  local_b0[0] = '\0';
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = outbuf;
  if (1 < (ulong)(((long)(modifiers->
                         super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(modifiers->
                         super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    std::__cxx11::string::reserve((ulong)&local_c0);
    local_78 = &PTR__ExpandEmitter_0014d320;
    local_60 = &PTR__ExpandEmitter_0014d320;
    pMVar3 = (modifiers->
             super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = pMVar3->value;
    local_e0 = local_d0;
    local_58 = &local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,pcVar1,pcVar1 + pMVar3->value_len);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e0);
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
    pTVar2 = ((modifiers->
              super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
              )._M_impl.super__Vector_impl_data._M_start)->modifier_info->modifier;
    (**pTVar2->_vptr_TemplateModifier)(pTVar2,in,inlen,data,&local_60,&local_a0);
    pMVar3 = (modifiers->
             super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             )._M_impl.super__Vector_impl_data._M_start + 1;
    inlen = local_b8;
    in = local_c0;
    if (pMVar3 != (modifiers->
                  super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                  )._M_impl.super__Vector_impl_data._M_finish + -1) {
      do {
        local_e0 = local_d0;
        local_d8 = 0;
        local_d0[0] = 0;
        std::__cxx11::string::reserve((ulong)&local_e0);
        local_70 = local_78;
        local_68 = (string *)&local_e0;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,pMVar3->value,pMVar3->value + pMVar3->value_len);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        pTVar2 = pMVar3->modifier_info->modifier;
        (**pTVar2->_vptr_TemplateModifier)
                  (pTVar2,local_c0,local_b8,data,&local_70,(string *)&local_a0);
        std::__cxx11::string::swap((string *)&local_c0);
        if (local_e0 != local_d0) {
          operator_delete(local_e0);
        }
        pMVar3 = pMVar3 + 1;
        inlen = local_b8;
        in = local_c0;
      } while (pMVar3 != (modifiers->
                         super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                         )._M_impl.super__Vector_impl_data._M_finish + -1);
    }
  }
  pMVar3 = (modifiers->
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((modifiers->
      super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>)
      ._M_impl.super__Vector_impl_data._M_start == pMVar3) {
    __assert_fail("!modifiers.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x36d,
                  "void ctemplate::EmitModifiedString(const vector<ModifierAndValue> &, const char *, size_t, const PerExpandData *, ExpandEmitter *)"
                 );
  }
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,pMVar3[-1].value,pMVar3[-1].value + pMVar3[-1].value_len);
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e0);
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  pTVar2 = ((modifiers->
            super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
            )._M_impl.super__Vector_impl_data._M_finish[-1].modifier_info)->modifier;
  (**pTVar2->_vptr_TemplateModifier)(pTVar2,in,inlen,data,local_80,&local_a0);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  return;
}

Assistant:

static void EmitModifiedString(const vector<ModifierAndValue>& modifiers,
                               const char* in, size_t inlen,
                               const PerExpandData* data,
                               ExpandEmitter* outbuf) {
  string result;
  string value_string;
  if (modifiers.size() > 1) {
    // If there's more than one modifiers, we need to store the
    // intermediate results in a temp-buffer.  We use a string.
    // We'll assume that each modifier adds about 12% to the input
    // size.
    result.reserve((inlen + inlen/8) + 16);
    StringEmitter scratchbuf(&result);
    value_string = string(modifiers.front().value, modifiers.front().value_len);
    modifiers.front().modifier_info->modifier->Modify(in, inlen, data,
                                                      &scratchbuf,
                                                      value_string);
    // Only used when modifiers.size() > 2
    for (vector<ModifierAndValue>::const_iterator it = modifiers.begin() + 1;
         it != modifiers.end()-1;  ++it) {
      string output_of_this_modifier;
      output_of_this_modifier.reserve(result.size() + result.size()/8 + 16);
      StringEmitter scratchbuf2(&output_of_this_modifier);
      value_string = string(it->value, it->value_len);
      it->modifier_info->modifier->Modify(result.c_str(), result.size(), data,
                                          &scratchbuf2, value_string);
      result.swap(output_of_this_modifier);
    }
    in = result.data();
    inlen = result.size();
  }
  // For the last modifier, we can write directly into outbuf
  assert(!modifiers.empty());
  value_string = string(modifiers.back().value, modifiers.back().value_len);
  modifiers.back().modifier_info->modifier->Modify(in, inlen, data, outbuf,
                                                   value_string);
}